

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_signparameter.cpp
# Opt level: O0

void __thiscall
SignParameter_DefaultConstructorTest_Test::TestBody(SignParameter_DefaultConstructorTest_Test *this)

{
  SignParameter sign_parameter;
  undefined1 in_stack_0000038f;
  Pubkey *in_stack_00000390;
  SignDataType in_stack_0000039c;
  ByteData *in_stack_000003a0;
  SignParameter *in_stack_000003a8;
  anon_class_1_0_00000001 *in_stack_000003b0;
  SigHashType *in_stack_000003c0;
  ByteData *in_stack_000003c8;
  SignParameter *this_00;
  ByteData local_e8;
  SignParameter *in_stack_ffffffffffffff30;
  Pubkey local_c0;
  ByteData local_98 [6];
  
  cfd::SignParameter::SignParameter(in_stack_ffffffffffffff30);
  cfd::core::ByteData::ByteData(local_98);
  cfd::core::Pubkey::Pubkey(&local_c0);
  cfd::core::SigHashType::SigHashType((SigHashType *)&stack0xffffffffffffff34);
  cfd::core::ByteData::ByteData(&local_e8);
  this_00 = (SignParameter *)&local_e8;
  ::anon_class_1_0_00000001::operator()
            (in_stack_000003b0,in_stack_000003a8,in_stack_000003a0,in_stack_0000039c,
             in_stack_00000390,(bool)in_stack_0000038f,in_stack_000003c0,in_stack_000003c8);
  cfd::core::ByteData::~ByteData((ByteData *)0x20474c);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x204756);
  cfd::core::ByteData::~ByteData((ByteData *)0x204760);
  cfd::SignParameter::~SignParameter(this_00);
  return;
}

Assistant:

TEST(SignParameter, DefaultConstructorTest)
{
  // default constructor
  SignParameter sign_parameter = SignParameter();
  CompareSignparameter(sign_parameter, ByteData(), SignDataType::kBinary,
      Pubkey(), false, SigHashType(), ByteData());
}